

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

void push(VarId *a)

{
  if (V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ((V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
      super__Vector_impl_data._M_finish)->super_Displayable)._vptr_Displayable =
         (_func_int **)&PTR_display_001eb100;
    (V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
     super__Vector_impl_data._M_finish)->id = a->id;
    V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
    super__Vector_impl_data._M_finish =
         V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    return;
  }
  std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
  _M_realloc_insert<mir::inst::VarId_const&>
            ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)&V,
             (iterator)
             V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
             super__Vector_impl_data._M_finish,a);
  return;
}

Assistant:

void push(mir::inst::VarId a) { V.push_back(a); }